

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O3

void __thiscall
TimerHeap::addTimer(TimerHeap *this,int id,long timeout_ms,timeoutCallBack *callBack)

{
  unordered_map<int,_std::weak_ptr<Timer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>_>
  *this_00;
  long *plVar1;
  element_type *this_01;
  element_type *peVar2;
  _Manager_type p_Var3;
  _Invoker_type p_Var4;
  pointer psVar5;
  pointer psVar6;
  int iVar7;
  _Atomic_word _Var8;
  iterator iVar9;
  mapped_type *pmVar10;
  undefined1 auVar11 [8];
  long lVar12;
  bool bVar13;
  timeType_ local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined1 local_50 [8];
  TimerPtr timer;
  int local_34 [2];
  int id_local;
  
  local_34[0] = id;
  if (this->timeFlag_ == false) {
    auVar11 = (undefined1  [8])(this->timeCache_).sec;
    lVar12 = (this->timeCache_).msec;
  }
  else {
    clock_gettime(1,(timespec *)local_50);
    (this->timeCache_).sec = (long)local_50;
    lVar12 = (long)timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr / 1000000;
    (this->timeCache_).msec = lVar12;
    this->timeFlag_ = false;
    auVar11 = local_50;
  }
  timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       ((long)&(((Timer *)auVar11)->timeout_).sec + (lVar12 + timeout_ms) / 1000);
  lVar12 = (lVar12 + timeout_ms) % 1000;
  this_00 = &this->timerMap_;
  iVar9 = std::
          _Hashtable<int,_std::pair<const_int,_std::weak_ptr<Timer>_>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,local_34);
  if (iVar9.super__Node_iterator_base<std::pair<const_int,_std::weak_ptr<Timer>_>,_false>._M_cur !=
      (__node_type *)0x0) {
    pmVar10 = std::__detail::
              _Map_base<int,_std::pair<const_int,_std::weak_ptr<Timer>_>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_std::weak_ptr<Timer>_>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,local_34);
    this_01 = (element_type *)
              (pmVar10->super___weak_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (this_01 != (element_type *)0x0) {
      _Var8 = (_Atomic_word)(this_01->timeout_).msec;
      do {
        if (_Var8 == 0) goto LAB_0011d562;
        plVar1 = &(this_01->timeout_).msec;
        LOCK();
        iVar7 = (int)*plVar1;
        bVar13 = _Var8 == iVar7;
        if (bVar13) {
          *(_Atomic_word *)plVar1 = _Var8 + 1;
          iVar7 = _Var8;
        }
        _Var8 = iVar7;
        UNLOCK();
      } while (!bVar13);
      peVar2 = (pmVar10->super___weak_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar2 != (element_type *)0x0 && (int)(this_01->timeout_).msec != 0) &&
         (peVar2->heapIndex_ != -1)) {
        (peVar2->timeout_).sec =
             (long)timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        (peVar2->timeout_).msec = lVar12;
        std::function<void_()>::operator=(&peVar2->callBack_,callBack);
        modify(this,(long)peVar2->heapIndex_);
        timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
        goto LAB_0011d667;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
  }
LAB_0011d562:
  local_50 = (undefined1  [8])operator_new(0x38);
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  p_Var3 = (callBack->super__Function_base)._M_manager;
  p_Var4 = callBack->_M_invoker;
  if (p_Var3 != (_Manager_type)0x0) {
    local_68 = *(undefined8 *)&(callBack->super__Function_base)._M_functor;
    uStack_60 = *(undefined8 *)((long)&(callBack->super__Function_base)._M_functor + 8);
    (callBack->super__Function_base)._M_manager = (_Manager_type)0x0;
    callBack->_M_invoker = (_Invoker_type)0x0;
  }
  psVar5 = (this->timerHeap_).
           super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  psVar6 = (this->timerHeap_).
           super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (((Timer *)local_50)->timeout_).sec =
       (long)timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (((Timer *)local_50)->timeout_).msec = lVar12;
  *(undefined8 *)&(((Timer *)local_50)->callBack_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(((Timer *)local_50)->callBack_).super__Function_base._M_functor + 8) = 0;
  (((Timer *)local_50)->callBack_).super__Function_base._M_manager = (_Manager_type)0x0;
  (((Timer *)local_50)->callBack_)._M_invoker = p_Var4;
  if (p_Var3 != (_Manager_type)0x0) {
    *(undefined8 *)&(((Timer *)local_50)->callBack_).super__Function_base._M_functor = local_68;
    *(undefined8 *)((long)&(((Timer *)local_50)->callBack_).super__Function_base._M_functor + 8) =
         uStack_60;
    (((Timer *)local_50)->callBack_).super__Function_base._M_manager = p_Var3;
  }
  ((Timer *)local_50)->heapIndex_ = (int)((ulong)((long)psVar5 - (long)psVar6) >> 4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Timer*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&timer,(Timer *)local_50);
  pmVar10 = std::__detail::
            _Map_base<int,_std::pair<const_int,_std::weak_ptr<Timer>_>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_std::weak_ptr<Timer>_>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,local_34);
  (pmVar10->super___weak_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)local_50;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar10->super___weak_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&timer);
  std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::push_back
            (&this->timerHeap_,(value_type *)local_50);
  upHeap(this,((long)(this->timerHeap_).
                     super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->timerHeap_).
                     super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) - 1);
  if ((undefined1  [8])
      (((this->timerHeap_).
        super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>._M_impl
        .super__Vector_impl_data._M_start)->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr == local_50) {
    local_78.sec = ((timeType_ *)local_50)->sec;
    local_78.msec = ((timeType_ *)local_50)->msec;
    setTime(this,&this->timeCache_,&local_78);
  }
  if (timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    return;
  }
LAB_0011d667:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

void TimerHeap::addTimer(int id, long timeout_ms, timeoutCallBack callBack) {
    if (timeFlag_) {
        struct timespec tv;
        clock_gettime(CLOCK_MONOTONIC, &tv);
        timeCache_.sec = tv.tv_sec;
        timeCache_.msec = tv.tv_nsec / 1000 / 1000;
        timeFlag_ = false;
    }
    Timer::timeType_ timeout(timeCache_);
    timeout.sec += (timeCache_.msec + timeout_ms) / 1000;
    timeout.msec = (timeCache_.msec + timeout_ms) % 1000;
    if (timerMap_.find(id) != timerMap_.end()) {
        TimerPtr tmp(timerMap_[id].lock());
        if (tmp && tmp->heapIndex_ != -1) {
            tmp->timeout_ = std::move(timeout);
            tmp->callBack_ = std::move(callBack);
            modify(tmp->heapIndex_);
            return;
        }
    }
    TimerPtr timer(new Timer(std::move(timeout), std::move(callBack), timerHeap_.size()));
    timerMap_[id] = timer;
    timerHeap_.push_back(timer);
    upHeap(timerHeap_.size() - 1);
    if (timerHeap_.front() == timer) { 
        setTime(timeCache_, timer->getTimeout());
    }
}